

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

int Js::DynamicTypeHandler::RoundUpSlotCapacity(int slotCapacity,PropertyIndex inlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *puVar4;
  int local_20;
  int local_1c;
  int local_18;
  int maxSlotCapacity;
  int auxSlotCapacity;
  uint uStack_c;
  PropertyIndex inlineSlotCapacity_local;
  int slotCapacity_local;
  
  maxSlotCapacity._2_2_ = inlineSlotCapacity;
  auxSlotCapacity = slotCapacity;
  if (slotCapacity < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x2f,"(slotCapacity >= 0)","slotCapacity >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((int)(uint)maxSlotCapacity._2_2_ < auxSlotCapacity) {
    local_18 = RoundUpAuxSlotCapacity(auxSlotCapacity - (uint)maxSlotCapacity._2_2_);
    if ((int)(local_18 + (uint)maxSlotCapacity._2_2_) < local_18) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x37,"(auxSlotCapacity + inlineSlotCapacity >= auxSlotCapacity)",
                                  "auxSlotCapacity + inlineSlotCapacity >= auxSlotCapacity");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_1c = 0x3fffffff;
    if (auxSlotCapacity < 0xffff) {
      local_1c = 0xfffe;
    }
    local_20 = (uint)maxSlotCapacity._2_2_ + local_18;
    puVar4 = (uint *)min<int>(&local_1c,&local_20);
    uStack_c = *puVar4;
  }
  else {
    uStack_c = (uint)maxSlotCapacity._2_2_;
  }
  return uStack_c;
}

Assistant:

int DynamicTypeHandler::RoundUpSlotCapacity(const int slotCapacity, const PropertyIndex inlineSlotCapacity)
    {
        Assert(slotCapacity >= 0);

        if(slotCapacity <= inlineSlotCapacity)
        {
            return inlineSlotCapacity;
        }

        const int auxSlotCapacity = RoundUpAuxSlotCapacity(slotCapacity - inlineSlotCapacity);
        Assert(auxSlotCapacity + inlineSlotCapacity >= auxSlotCapacity);
        const int maxSlotCapacity =
            slotCapacity <= PropertyIndexRanges<PropertyIndex>::MaxValue
                ? PropertyIndexRanges<PropertyIndex>::MaxValue
                : PropertyIndexRanges<BigPropertyIndex>::MaxValue;
        return min(maxSlotCapacity, inlineSlotCapacity + auxSlotCapacity);
    }